

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void TestSuite::failHandler(void)

{
  ulong uVar1;
  ostream *poVar2;
  string *psVar3;
  
  getInfoMsg_abi_cxx11_();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"        info: ");
    psVar3 = getInfoMsg_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

static void failHandler() {
        if (!getInfoMsg().empty()) {
            std::cout << "        info: " << getInfoMsg() << std::endl;
        }
    }